

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O3

void duckdb::ArrayGenericFold<double,duckdb::CosineSimilarityOp>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  double dVar1;
  double dVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  BoundFunctionExpression *pBVar7;
  reference pvVar8;
  Vector *vector;
  Vector *vector_00;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  ulong uVar11;
  InvalidInputException *pIVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  UnifiedVectorFormat rhs_format;
  UnifiedVectorFormat lhs_format;
  string local_178;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  double local_118;
  double dStack_110;
  string local_100;
  string local_e0;
  long *local_c0 [2];
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78 [2];
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pBVar7 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pbVar3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(args + 0x18);
  pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector = (Vector *)duckdb::ArrayVector::GetEntry(pvVar8);
  pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  vector_00 = (Vector *)duckdb::ArrayVector::GetEntry(pvVar8);
  FlatVector::VerifyFlatVector(vector);
  FlatVector::VerifyFlatVector(vector_00);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c0);
  pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar8,(UnifiedVectorFormat *)pbVar3);
  pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  duckdb::Vector::ToUnifiedFormat((ulong)pvVar8,(UnifiedVectorFormat *)pbVar3);
  lVar4 = *(long *)(vector + 0x20);
  lVar5 = *(long *)(vector_00 + 0x20);
  lVar6 = *(long *)(result + 0x20);
  pvVar8 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  lVar9 = duckdb::ArrayType::GetSize((LogicalType *)(pvVar8 + 8));
  if (pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    do {
      pbVar10 = pbVar14;
      if (*local_78[0] != 0) {
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)*(uint *)(*local_78[0] + (long)pbVar14 * 4);
      }
      pbVar13 = pbVar14;
      if (*local_c0[0] != 0) {
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)*(uint *)(*local_c0[0] + (long)pbVar14 * 4);
      }
      if (((local_68 == 0) ||
          ((*(ulong *)(local_68 + ((ulong)pbVar10 >> 6) * 8) >> ((ulong)pbVar10 & 0x3f) & 1) != 0))
         && ((local_b0 == 0 ||
             ((*(ulong *)(local_b0 + ((ulong)pbVar13 >> 6) * 8) >> ((ulong)pbVar13 & 0x3f) & 1) != 0
             )))) {
        uVar11 = (long)pbVar10 * lVar9;
        lVar15 = lVar9;
        uVar16 = uVar11;
        if (uVar11 < uVar11 + lVar9 && *(long *)(vector + 0x28) != 0) {
          do {
            if ((*(ulong *)(*(long *)(vector + 0x28) + (uVar16 >> 6) * 8) >> (uVar16 & 0x3f) & 1) ==
                0) {
              pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_138[0] = local_128;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_138,"%s: left argument can not contain NULL values","");
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,*(long *)(pBVar7 + 0x60),
                         *(long *)(pBVar7 + 0x68) + *(long *)(pBVar7 + 0x60));
              StringUtil::Format<std::__cxx11::string>
                        (&local_178,(StringUtil *)local_138,&local_e0,pbVar13);
              duckdb::InvalidInputException::InvalidInputException(pIVar12,(string *)&local_178);
              __cxa_throw(pIVar12,&InvalidInputException::typeinfo,
                          std::runtime_error::~runtime_error);
            }
            uVar16 = uVar16 + 1;
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)pbVar13 * lVar9);
        lVar15 = lVar9;
        pbVar10 = pbVar13;
        if (pbVar13 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&(pbVar13->_M_dataplus)._M_p + lVar9) &&
            *(long *)(vector_00 + 0x28) != 0) {
          do {
            if ((*(ulong *)(*(long *)(vector_00 + 0x28) + ((ulong)pbVar10 >> 6) * 8) >>
                 ((ulong)pbVar10 & 0x3f) & 1) == 0) {
              pIVar12 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_158[0] = local_148;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_158,"%s: right argument can not contain NULL values","");
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_100,*(long *)(pBVar7 + 0x60),
                         *(long *)(pBVar7 + 0x68) + *(long *)(pBVar7 + 0x60));
              StringUtil::Format<std::__cxx11::string>
                        (&local_178,(StringUtil *)local_158,&local_100,pbVar13);
              duckdb::InvalidInputException::InvalidInputException(pIVar12,(string *)&local_178);
              __cxa_throw(pIVar12,&InvalidInputException::typeinfo,
                          std::runtime_error::~runtime_error);
            }
            pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&(pbVar10->_M_dataplus)._M_p + 1);
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
        }
        if (lVar9 == 0) {
          dVar18 = 0.0;
          dVar19 = 0.0;
          dVar17 = 0.0;
        }
        else {
          dVar18 = 0.0;
          dVar19 = 0.0;
          dVar17 = 0.0;
          lVar15 = 0;
          do {
            dVar1 = *(double *)(lVar5 + (long)pbVar13 * 8 + lVar15 * 8);
            dVar2 = *(double *)(lVar4 + uVar11 * 8 + lVar15 * 8);
            dVar18 = dVar18 + dVar2 * dVar1;
            dVar19 = dVar19 + dVar2 * dVar2;
            dVar17 = dVar17 + dVar1 * dVar1;
            lVar15 = lVar15 + 1;
          } while (lVar9 != lVar15);
          dVar17 = dVar19 * dVar17;
        }
        if (dVar17 < 0.0) {
          local_118 = dVar18;
          dStack_110 = dVar19;
          dVar17 = sqrt(dVar17);
          dVar18 = local_118;
        }
        else {
          dVar17 = SQRT(dVar17);
        }
        dVar19 = 1.0;
        if (dVar18 / dVar17 <= 1.0) {
          dVar19 = dVar18 / dVar17;
        }
        if (dVar19 <= -1.0) {
          dVar19 = -1.0;
        }
        *(double *)(lVar6 + (long)pbVar14 * 8) = dVar19;
      }
      else {
        duckdb::FlatVector::SetNull(result,(ulong)pbVar14,true);
      }
      pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)&(pbVar14->_M_dataplus)._M_p + 1);
    } while (pbVar14 != pbVar3);
    if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1) {
      duckdb::Vector::SetVectorType((VectorType)result);
    }
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

static void ArrayGenericFold(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto &lstate = state.Cast<ExecuteFunctionState>();
	const auto &expr = lstate.expr.Cast<BoundFunctionExpression>();
	const auto &func_name = expr.function.name;

	const auto count = args.size();
	auto &lhs_child = ArrayVector::GetEntry(args.data[0]);
	auto &rhs_child = ArrayVector::GetEntry(args.data[1]);

	const auto &lhs_child_validity = FlatVector::Validity(lhs_child);
	const auto &rhs_child_validity = FlatVector::Validity(rhs_child);

	UnifiedVectorFormat lhs_format;
	UnifiedVectorFormat rhs_format;

	args.data[0].ToUnifiedFormat(count, lhs_format);
	args.data[1].ToUnifiedFormat(count, rhs_format);

	auto lhs_data = FlatVector::GetData<TYPE>(lhs_child);
	auto rhs_data = FlatVector::GetData<TYPE>(rhs_child);
	auto res_data = FlatVector::GetData<TYPE>(result);

	const auto array_size = ArrayType::GetSize(args.data[0].GetType());
	D_ASSERT(array_size == ArrayType::GetSize(args.data[1].GetType()));

	for (idx_t i = 0; i < count; i++) {
		const auto lhs_idx = lhs_format.sel->get_index(i);
		const auto rhs_idx = rhs_format.sel->get_index(i);

		if (!lhs_format.validity.RowIsValid(lhs_idx) || !rhs_format.validity.RowIsValid(rhs_idx)) {
			FlatVector::SetNull(result, i, true);
			continue;
		}

		const auto left_offset = lhs_idx * array_size;
		if (!lhs_child_validity.CheckAllValid(left_offset + array_size, left_offset)) {
			throw InvalidInputException(StringUtil::Format("%s: left argument can not contain NULL values", func_name));
		}

		const auto right_offset = rhs_idx * array_size;
		if (!rhs_child_validity.CheckAllValid(right_offset + array_size, right_offset)) {
			throw InvalidInputException(
			    StringUtil::Format("%s: right argument can not contain NULL values", func_name));
		}

		const auto lhs_data_ptr = lhs_data + left_offset;
		const auto rhs_data_ptr = rhs_data + right_offset;

		res_data[i] = OP::Operation(lhs_data_ptr, rhs_data_ptr, array_size);
	}

	if (count == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}